

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O2

shared_ptr<Form>
buildList(vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_> *forms)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long *in_RSI;
  shared_ptr<Form> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (*in_RSI == in_RSI[1]) {
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)forms,
               &gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    sVar2 = buildList((shared_ptr<Form> *)forms,(int)*in_RSI);
    _Var1 = sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)forms;
  return (shared_ptr<Form>)sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::vector<std::shared_ptr<Form>>& forms) {
  if(forms.empty()) {
    return gSymbolTable.getEmptyPair();
  }
  return buildList(forms.data(), forms.size());
}